

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O0

void __thiscall
adios2::aggregator::MPIShmChain::Init
          (MPIShmChain *this,size_t numAggregators,size_t subStreams,Comm *parentComm)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  unsigned_long uVar4;
  HandshakeStruct *this_00;
  unsigned_long *in_RCX;
  undefined8 in_RDX;
  long in_RDI;
  float fVar5;
  HandshakeStruct hs;
  HandshakeStruct hsAC;
  int color;
  float c;
  float k;
  size_t aggregatorPerNode;
  size_t NodeSize;
  int NodeRank;
  Comm *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe7c;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  Comm *in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe94;
  int *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  Comm *in_stack_fffffffffffffee8;
  MPIShmChain *in_stack_fffffffffffffef0;
  HandshakeStruct *in_stack_fffffffffffffef8;
  MPIShmChain *in_stack_ffffffffffffff00;
  allocator local_e1;
  string local_e0 [47];
  allocator local_b1;
  string local_b0 [63];
  allocator local_71;
  string local_70 [16];
  HandshakeStruct *in_stack_ffffffffffffffa0;
  Comm *in_stack_ffffffffffffffa8;
  MPIShmChain *in_stack_ffffffffffffffb0;
  
  if ((*(byte *)(in_RDI + 0x51) & 1) == 0) {
    PreInit(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  iVar1 = helper::Comm::Rank((Comm *)0xd75373);
  helper::Comm::Size((Comm *)0xd7538b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"creating aggregator groups at Open",&local_71);
  helper::Comm::Split(in_stack_fffffffffffffe88,(int)in_stack_fffffffffffffe84,
                      (int)in_stack_fffffffffffffe80,
                      (string *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  helper::Comm::operator=
            ((Comm *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  helper::Comm::~Comm((Comm *)0xd75579);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  iVar2 = helper::Comm::Rank((Comm *)0xd755a4);
  *(int *)(in_RDI + 0x28) = iVar2;
  iVar2 = helper::Comm::Size((Comm *)0xd755b8);
  *(int *)(in_RDI + 0x2c) = iVar2;
  if (*(int *)(in_RDI + 0x28) != 0) {
    *(undefined1 *)(in_RDI + 0x30) = 0;
    *(undefined1 *)(in_RDI + 0x50) = 0;
  }
  if (*(int *)(in_RDI + 0x28) == 0) {
    iVar2 = helper::Comm::Rank((Comm *)0xd75664);
    *(int *)(in_RDI + 0x34) = iVar2;
  }
  iVar2 = helper::Comm::BroadcastValue<int>
                    ((Comm *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe98,(int)in_stack_fffffffffffffe94);
  *(int *)(in_RDI + 0x34) = iVar2;
  uVar3 = (uint)(*(int *)(in_RDI + 0x28) != 0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"creating comm of all aggregators at Open",&local_b1);
  helper::Comm::Split(in_stack_fffffffffffffe88,(int)in_stack_fffffffffffffe84,
                      (int)in_stack_fffffffffffffe80,
                      (string *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  helper::Comm::operator=
            ((Comm *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  helper::Comm::~Comm((Comm *)0xd75739);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  if (iVar1 == 0) {
    iVar1 = helper::Comm::Size((Comm *)0xd75772);
    *(long *)(in_RDI + 0x18) = (long)iVar1;
  }
  uVar4 = helper::Comm::BroadcastValue<unsigned_long>
                    ((Comm *)CONCAT44(uVar3,in_stack_fffffffffffffea0),in_RCX,
                     (int)in_stack_fffffffffffffe94);
  *(unsigned_long *)(in_RDI + 0x18) = uVar4;
  *(undefined8 *)(in_RDI + 8) = in_RDX;
  if (*(long *)(in_RDI + 8) == 0) {
    *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 0x18);
  }
  if (*(ulong *)(in_RDI + 0x18) < *(ulong *)(in_RDI + 8)) {
    *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 0x18);
  }
  if (*(int *)(in_RDI + 0x28) == 0) {
    in_stack_fffffffffffffe88 = *(Comm **)(in_RDI + 8);
    in_stack_fffffffffffffe7c = (float)*(ulong *)(in_RDI + 0x18);
    in_stack_fffffffffffffe80 = (float)(long)in_stack_fffffffffffffe88;
    in_stack_fffffffffffffe84 = (float)in_stack_fffffffffffffe88;
    fVar5 = in_stack_fffffffffffffe7c / in_stack_fffffffffffffe84;
    in_stack_fffffffffffffe94 = in_stack_fffffffffffffe7c;
    iVar1 = helper::Comm::Rank((Comm *)0xd75933);
    *(long *)(in_RDI + 0x10) = (long)(int)((float)iVar1 / fVar5);
  }
  uVar4 = helper::Comm::BroadcastValue<unsigned_long>
                    ((Comm *)CONCAT44(uVar3,in_stack_fffffffffffffea0),in_RCX,
                     (int)in_stack_fffffffffffffe94);
  *(unsigned_long *)(in_RDI + 0x10) = uVar4;
  this_00 = (HandshakeStruct *)(in_RDI + 0x70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"creating chains of aggregators at Open",&local_e1);
  helper::Comm::Split(in_stack_fffffffffffffe88,(int)in_stack_fffffffffffffe84,
                      (int)in_stack_fffffffffffffe80,
                      (string *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  helper::Comm::operator=
            ((Comm *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  helper::Comm::~Comm((Comm *)0xd75a21);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  iVar1 = helper::Comm::Rank((Comm *)0xd75a4c);
  if (iVar1 != 0) {
    *(undefined1 *)(in_RDI + 0x50) = 0;
  }
  HandshakeStruct::HandshakeStruct(this_00);
  iVar1 = helper::Comm::Size((Comm *)0xd75ae9);
  if (1 < iVar1) {
    HandshakeLinks_Start
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  *(undefined1 *)(in_RDI + 0x31) = 1;
  iVar1 = helper::Comm::Size((Comm *)0xd75b46);
  if (1 < iVar1) {
    HandshakeStruct::HandshakeStruct(this_00);
    HandshakeLinks_Start
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    HandshakeLinks_Complete(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    HandshakeStruct::~HandshakeStruct
              ((HandshakeStruct *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  }
  iVar1 = helper::Comm::Size((Comm *)0xd75bdc);
  if (1 < iVar1) {
    HandshakeLinks_Complete(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  HandshakeStruct::~HandshakeStruct((HandshakeStruct *)CONCAT44(iVar1,in_stack_fffffffffffffe50));
  return;
}

Assistant:

void MPIShmChain::Init(const size_t numAggregators, const size_t subStreams,
                       helper::Comm const &parentComm)
{
    if (!PreInitCalled)
    {
        PreInit(parentComm);
    }

    // int AllRank = parentComm.Rank();
    // int AllSize = parentComm.Size();
    int NodeRank = m_NodeComm.Rank();
    size_t NodeSize = static_cast<size_t>(m_NodeComm.Size());

    /* Number of aggregators per node */
    size_t aggregatorPerNode = numAggregators / m_NumNodes;
    if (aggregatorPerNode == 0)
    {
        aggregatorPerNode = 1; /* default */
    }
    if (aggregatorPerNode > NodeSize)
    {
        aggregatorPerNode = NodeSize;
    }

    /* Create main communicator that splits the node comm into one or more
     * aggregator chains */
    float k = static_cast<float>(NodeSize) / static_cast<float>(aggregatorPerNode);
    float c = static_cast<float>(NodeRank) / k;
    int color = static_cast<int>(c);
    m_Comm = m_NodeComm.Split(color, 0, "creating aggregator groups at Open");
    m_Rank = m_Comm.Rank();
    m_Size = m_Comm.Size();
    if (m_Rank != 0)
    {
        m_IsAggregator = false;
        m_IsMasterAggregator = false;
    }

    /* Identify parent rank of aggregator process within each chain */
    if (!m_Rank)
    {
        m_AggregatorRank = parentComm.Rank();
    }
    m_AggregatorRank = m_Comm.BroadcastValue<int>(m_AggregatorRank, 0);

    /* Communicator for all Aggregators */
    color = (m_Rank ? 1 : 0);
    m_AllAggregatorsComm = parentComm.Split(color, 0, "creating comm of all aggregators at Open");

    /* Total number of aggregators */
    if (!NodeRank)
    {
        m_NumAggregators = static_cast<size_t>(m_AllAggregatorsComm.Size());
    }
    m_NumAggregators = m_NodeComm.BroadcastValue<size_t>(m_NumAggregators);

    /* Number of substreams */
    m_SubStreams = subStreams;
    if (m_SubStreams == 0)
    {
        m_SubStreams = m_NumAggregators; /* default */
    }
    if (m_SubStreams > m_NumAggregators)
    {
        m_SubStreams = m_NumAggregators;
    }

    if (!m_Rank)
    {
        k = static_cast<float>(m_NumAggregators) / static_cast<float>(m_SubStreams);
        /* 1.0 <= k <= m_NumAggregators */
        c = static_cast<float>(m_AllAggregatorsComm.Rank()) / k;
        m_SubStreamIndex = static_cast<int>(c);
    }
    m_SubStreamIndex = m_Comm.BroadcastValue<size_t>(m_SubStreamIndex);

    /* Create the communicator to connect aggregators writing to the same
     * substream */
    color = static_cast<int>(m_SubStreamIndex);
    m_AggregatorChainComm =
        m_AllAggregatorsComm.Split(color, 0, "creating chains of aggregators at Open");

    if (m_AggregatorChainComm.Rank() != 0)
    {
        m_IsMasterAggregator = false;
    }
    HandshakeStruct hsAC; // need persistence until complete
    if (m_AggregatorChainComm.Size() > 1)
    {
        HandshakeLinks_Start(m_AggregatorChainComm, hsAC);
    }

    m_IsActive = true;

    if (m_Comm.Size() > 1)
    {
        HandshakeStruct hs; // need persistence until complete
        HandshakeLinks_Start(m_Comm, hs);

        /* Create the shared memory segment */
        // CreateShm();

        HandshakeLinks_Complete(hs);
    }

    if (m_AggregatorChainComm.Size() > 1)
    {
        HandshakeLinks_Complete(hsAC);
    }
}